

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeMemPutIpcHandle(ze_context_handle_t hContext,ze_ipc_mem_handle_t handle)

{
  _func_void__ze_mem_put_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr *p_Var1;
  _ze_ipc_mem_handle_t _Var2;
  _func__ze_result_t__ze_context_handle_t_ptr__ze_ipc_mem_handle_t *p_Var3;
  ze_pfnMemPutIpcHandle_t p_Var4;
  char *pcVar5;
  undefined1 *puVar6;
  ulong *puVar7;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_128;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_110;
  undefined1 local_f8 [8];
  APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnMemPutIpcHandleCb_t epilogue_callback_ptr;
  ze_pfnMemPutIpcHandleCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_mem_put_ipc_handle_params_t tracerParams;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  ze_pfnMemPutIpcHandle_t pfnPutIpcHandle;
  ze_context_handle_t hContext_local;
  
  if (_DAT_002da640 == (_func__ze_result_t__ze_context_handle_t_ptr__ze_ipc_mem_handle_t *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnPutIpcHandle = (ze_pfnMemPutIpcHandle_t)hContext;
    pcVar5 = (char *)tracingInProgress();
    p_Var4 = pfnPutIpcHandle;
    p_Var3 = _DAT_002da640;
    if (*pcVar5 == '\0') {
      puVar6 = (undefined1 *)tracingInProgress();
      *puVar6 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pfnPutIpcHandle;
      tracerParams.phContext = (ze_context_handle_t *)&handle;
      APITracerCallbackDataImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar7 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar7 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnMemPutIpcHandleCb_t)0x0;
            prologueCallbackPtr < (ze_pfnMemPutIpcHandleCb_t)*puVar7;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar7[1] + (long)prologueCallbackPtr * 0xcb8 + 0x550);
          p_Var1 = *(_func_void__ze_mem_put_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar7[1] + (long)prologueCallbackPtr * 0xcb8 + 0xba8);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_mem_put_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar7[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_f8 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_f8)
          ;
        }
      }
      p_Var3 = _DAT_002da640;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_110,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_128,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hContext_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_context_handle_t*,_ze_ipc_mem_handle_t),_ze_mem_put_ipc_handle_params_t*,void(*)(_ze_mem_put_ipc_handle_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_put_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_put_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_put_ipc_handle_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_mem_put_ipc_handle_params_t*,_ze_result_t,void*,void**)>>>,_ze_context_handle_t*&,_ze_ipc_mem_handle_t&>
                     (p_Var3,(_ze_mem_put_ipc_handle_params_t *)
                             &apiCallbackData.epilogCallbacks.
                              super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_mem_put_ipc_handle_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_110,&local_128,
                      (_ze_context_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_ze_ipc_mem_handle_t *)tracerParams.phContext);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_128);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_110);
      APITracerCallbackDataImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_mem_put_ipc_handle_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      memcpy(&tracerParams.phandle,&handle,0x40);
      _Var2.data._8_8_ = uStack_58;
      _Var2.data._0_8_ = tracerParams.phandle;
      _Var2.data._16_8_ = local_50;
      _Var2.data._24_8_ = uStack_48;
      _Var2.data._32_8_ = local_40;
      _Var2.data._40_8_ = uStack_38;
      _Var2.data._48_8_ = local_30;
      _Var2.data._56_8_ = uStack_28;
      hContext_local._4_4_ = (*p_Var3)((_ze_context_handle_t *)p_Var4,_Var2);
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemPutIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_ipc_mem_handle_t handle                      ///< [in] IPC memory handle
        )
    {
        auto pfnPutIpcHandle = context.zeDdiTable.Mem.pfnPutIpcHandle;

        if( nullptr == pfnPutIpcHandle)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Mem.pfnPutIpcHandle, hContext, handle);

        // capture parameters
        ze_mem_put_ipc_handle_params_t tracerParams = {
            &hContext,
            &handle
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnMemPutIpcHandleCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnMemPutIpcHandleCb_t, Mem, pfnPutIpcHandleCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Mem.pfnPutIpcHandle,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phContext,
                                                  *tracerParams.phandle);
    }